

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O2

GLuint __thiscall gl4cts::EnhancedLayouts::Utils::Type::GetNumComponents(Type *this)

{
  GLuint GVar1;
  
  GVar1 = 4;
  if (this->m_n_rows != 3) {
    GVar1 = this->m_n_rows;
  }
  return GVar1 * this->m_n_columns << (this->m_basic_type == Double);
}

Assistant:

GLuint Type::GetNumComponents() const
{
	// Rule 3 of Section 7.6.2.2
	// If the member is a three-component vector with components consuming N
	// basic machine units, the base alignment is 4N.
	GLuint num_components = (m_n_rows == 3 ? 4 : m_n_rows) * m_n_columns;

	if (m_basic_type == Double)
	{
		num_components *= 2;
	}

	return num_components;
}